

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerSettings.cpp
# Opt level: O0

char * __thiscall SpiAnalyzerSettings::SaveSettings(SpiAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive local_18 [8];
  SimpleArchive text_archive;
  SpiAnalyzerSettings *this_local;
  
  _text_archive = this;
  SimpleArchive::SimpleArchive(local_18);
  SimpleArchive::operator<<(local_18,"SaleaeSpiAnalyzer");
  SimpleArchive::operator<<(local_18,&this->mMosiChannel);
  SimpleArchive::operator<<(local_18,&this->mMisoChannel);
  SimpleArchive::operator<<(local_18,&this->mClockChannel);
  SimpleArchive::operator<<(local_18,&this->mEnableChannel);
  SimpleArchive::operator<<(local_18,this->mShiftOrder);
  SimpleArchive::operator<<(local_18,this->mBitsPerTransfer);
  SimpleArchive::operator<<(local_18,this->mClockInactiveState);
  SimpleArchive::operator<<(local_18,this->mDataValidEdge);
  SimpleArchive::operator<<(local_18,this->mEnableActiveState);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(local_18);
  return pcVar1;
}

Assistant:

const char* SpiAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << "SaleaeSpiAnalyzer";
    text_archive << mMosiChannel;
    text_archive << mMisoChannel;
    text_archive << mClockChannel;
    text_archive << mEnableChannel;
    text_archive << mShiftOrder;
    text_archive << mBitsPerTransfer;
    text_archive << mClockInactiveState;
    text_archive << mDataValidEdge;
    text_archive << mEnableActiveState;

    return SetReturnString( text_archive.GetString() );
}